

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O2

bool __thiscall TimeOffsets::WarnIfOutOfSync(TimeOffsets *this)

{
  long lVar1;
  Warnings *this_00;
  bilingual_str message;
  seconds sVar2;
  seconds sVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  _Move_assign_alias<kernel::Warning,_node::Warning> in_stack_ffffffffffffff08;
  _Alloc_hider _Var5;
  undefined1 in_stack_ffffffffffffff18 [56];
  undefined1 auVar6 [32];
  bilingual_str local_a8;
  bilingual_str msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = Median(this);
  sVar3.__r = 0x8000000000000001;
  if (-0x7fffffffffffffff < sVar2.__r) {
    sVar3 = sVar2;
  }
  uVar4 = -sVar3.__r;
  if (0 < sVar3.__r) {
    uVar4 = sVar3.__r;
  }
  if (uVar4 < 0x259) {
    ::node::Warnings::Unset
              (this->m_warnings,
               (warning_type)
               in_stack_ffffffffffffff08.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
               super__Move_ctor_alias<kernel::Warning,_node::Warning>.
               super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
               super__Variant_storage_alias<kernel::Warning,_node::Warning>);
  }
  else {
    _(&local_a8,(ConstevalStringLiteral)0x6a7863);
    _Var5._M_p = (pointer)0xa;
    tinyformat::format<long>(&msg,&local_a8,(long *)&stack0xffffffffffffff10);
    bilingual_str::~bilingual_str(&local_a8);
    logging_function._M_str = "WarnIfOutOfSync";
    logging_function._M_len = 0xf;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/timeoffsets.cpp"
    ;
    source_file._M_len = 100;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x3f,ALL,Warning,(ConstevalFormatString<1U>)0x723afd,
               &msg.original);
    this_00 = this->m_warnings;
    bilingual_str::bilingual_str((bilingual_str *)&stack0xffffffffffffff18,&msg);
    auVar6 = in_stack_ffffffffffffff18._24_32_;
    message.original._M_string_length = in_stack_ffffffffffffff18._0_8_;
    message.original.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_ffffffffffffff18._8_16_;
    message.translated._M_dataplus._M_p = (pointer)auVar6._0_8_;
    message.translated._M_string_length = auVar6._8_8_;
    message.translated.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )auVar6._16_16_;
    message.original._M_dataplus._M_p = _Var5._M_p;
    ::node::Warnings::Set
              (this_00,(warning_type)
                       in_stack_ffffffffffffff08.
                       super__Copy_assign_alias<kernel::Warning,_node::Warning>.
                       super__Move_ctor_alias<kernel::Warning,_node::Warning>.
                       super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
                       super__Variant_storage_alias<kernel::Warning,_node::Warning>,message);
    bilingual_str::~bilingual_str((bilingual_str *)&stack0xffffffffffffff18);
    bilingual_str::~bilingual_str(&msg);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 600 < uVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool TimeOffsets::WarnIfOutOfSync() const
{
    // when median == std::numeric_limits<int64_t>::min(), calling std::chrono::abs is UB
    auto median{std::max(Median(), std::chrono::seconds(std::numeric_limits<int64_t>::min() + 1))};
    if (std::chrono::abs(median) <= WARN_THRESHOLD) {
        m_warnings.Unset(node::Warning::CLOCK_OUT_OF_SYNC);
        return false;
    }

    bilingual_str msg{strprintf(_(
        "Your computer's date and time appear to be more than %d minutes out of sync with the network, "
        "this may lead to consensus failure. After you've confirmed your computer's clock, this message "
        "should no longer appear when you restart your node. Without a restart, it should stop showing "
        "automatically after you've connected to a sufficient number of new outbound peers, which may "
        "take some time. You can inspect the `timeoffset` field of the `getpeerinfo` and `getnetworkinfo` "
        "RPC methods to get more info."
    ), Ticks<std::chrono::minutes>(WARN_THRESHOLD))};
    LogWarning("%s\n", msg.original);
    m_warnings.Set(node::Warning::CLOCK_OUT_OF_SYNC, msg);
    return true;
}